

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_moe_ffn
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *gate_inp,ggml_tensor *up_exps,
          ggml_tensor *gate_exps,ggml_tensor *down_exps,ggml_tensor *exp_probs_b,int64_t n_expert,
          int64_t n_expert_used,llm_ffn_op_type type_op,bool norm_w,bool scale_w,float w_scale,
          llama_expert_gating_func_type gating_op,int il)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 *puVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *in_RCX;
  llm_graph_context *in_RDX;
  long in_RSI;
  int *in_RDI;
  undefined4 in_XMM0_Da;
  long in_stack_00000008;
  undefined8 in_stack_00000010;
  ulong in_stack_00000018;
  int in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  ggml_tensor *cur_expert;
  int i;
  ggml_tensor *moe_out;
  ggml_tensor *experts;
  ggml_tensor *par;
  ggml_tensor *gate;
  ggml_tensor *up;
  ggml_tensor *repeated;
  ggml_tensor *weights_sum;
  ggml_tensor *weights;
  ggml_tensor *selected_experts;
  ggml_tensor *selection_probs;
  ggml_tensor *probs;
  ggml_tensor *logits;
  bool weight_before_ffn;
  int64_t n_tokens;
  int64_t n_embd;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *name;
  int local_b4;
  ggml_tensor *local_b0;
  ggml_tensor *local_a8;
  ggml_tensor *in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *in_stack_ffffffffffffff78;
  llm_graph_context *in_stack_ffffffffffffff80;
  undefined8 local_78;
  ggml_tensor *local_68;
  ggml_tensor *local_60;
  
  uVar2 = *(undefined8 *)(in_RSI + 0x10);
  uVar3 = *(undefined8 *)(in_RSI + 0x18);
  iVar1 = *in_RDI;
  pgVar4 = build_lora_mm((llm_graph_context *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         in_stack_ffffffffffffff60);
  cb(in_RDX,in_RCX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if ((int)cur_expert == 1) {
    local_60 = (ggml_tensor *)ggml_soft_max(*(undefined8 *)(in_RDI + 0x30),pgVar4);
  }
  else {
    if ((int)cur_expert != 2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x35d,"fatal error");
    }
    local_60 = (ggml_tensor *)ggml_sigmoid(*(undefined8 *)(in_RDI + 0x30),pgVar4);
  }
  cb(in_RDX,in_RCX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  local_68 = local_60;
  if (in_stack_00000008 != 0) {
    local_68 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0x30),local_60,in_stack_00000008);
    cb(in_RDX,in_RCX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  if (*in_RDI == 1) {
    local_68 = pgVar4;
  }
  uVar5 = ggml_top_k(*(undefined8 *)(in_RDI + 0x30),local_68,in_stack_00000018 & 0xffffffff);
  cb(in_RDX,in_RCX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  cb(in_RDX,in_RCX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  name = *(char **)(in_RDI + 0x30);
  uVar6 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),local_60,1,in_stack_00000010,uVar3);
  local_78 = ggml_get_rows(name,uVar6,uVar5);
  cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
  if ((in_stack_00000028 & 1) != 0) {
    uVar5 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0x30),local_78,in_stack_00000018,uVar3);
    in_stack_ffffffffffffff80 =
         (llm_graph_context *)ggml_sum_rows(*(undefined8 *)(in_RDI + 0x30),uVar5);
    cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
    uVar5 = ggml_div(*(undefined8 *)(in_RDI + 0x30),uVar5,in_stack_ffffffffffffff80);
    cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
    local_78 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),uVar5,1,in_stack_00000018,uVar3);
  }
  if ((in_stack_00000030 & 1) != 0) {
    local_78 = ggml_scale(in_XMM0_Da,*(undefined8 *)(in_RDI + 0x30),local_78);
    cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
  }
  puVar7 = (undefined4 *)ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),in_RSI,uVar2,1,uVar3);
  if (iVar1 == 1) {
    uVar5 = ggml_new_tensor_3d(*(undefined8 *)(in_RDI + 0x30),*puVar7,uVar2,in_stack_00000018,uVar3)
    ;
    in_stack_ffffffffffffff78 =
         (ggml_tensor *)ggml_repeat(*(undefined8 *)(in_RDI + 0x30),puVar7,uVar5);
    ggml_mul(*(undefined8 *)(in_RDI + 0x30),in_stack_ffffffffffffff78,local_78);
    cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
  }
  pgVar4 = build_lora_mm_id(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
  pgVar8 = build_lora_mm_id(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,pgVar4,
                            in_stack_ffffffffffffff68);
  cb(in_RDX,in_RCX,name,in_stack_ffffffffffffff0c);
  if (in_stack_00000020 == 0) {
    pgVar8 = (ggml_tensor *)ggml_silu(*(undefined8 *)(in_RDI + 0x30),pgVar8);
    cb(in_RDX,in_RCX,name,in_stack_00000020);
  }
  else {
    if (in_stack_00000020 != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x3a4,"fatal error");
    }
    pgVar8 = (ggml_tensor *)ggml_gelu(*(undefined8 *)(in_RDI + 0x30),pgVar8);
    cb(in_RDX,in_RCX,name,in_stack_00000020);
  }
  ggml_mul(*(undefined8 *)(in_RDI + 0x30),pgVar4,pgVar8);
  cb(in_RDX,in_RCX,name,in_stack_00000020);
  local_a8 = build_lora_mm_id(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,pgVar4,pgVar8);
  cb(in_RDX,in_RCX,name,in_stack_00000020);
  if (iVar1 != 1) {
    local_a8 = (ggml_tensor *)ggml_mul(*(undefined8 *)(in_RDI + 0x30),local_a8,local_78);
    cb(in_RDX,in_RCX,name,in_stack_00000020);
  }
  local_b0 = (ggml_tensor *)0x0;
  for (local_b4 = 0; (long)local_b4 < (long)in_stack_00000018; local_b4 = local_b4 + 1) {
    pgVar4 = (ggml_tensor *)
             ggml_view_2d(*(undefined8 *)(in_RDI + 0x30),local_a8,uVar2,uVar3,local_a8->nb[2],
                          (long)local_b4 * local_a8->nb[1]);
    if (local_b4 != 0) {
      pgVar4 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0x30),local_b0,pgVar4);
    }
    local_b0 = pgVar4;
  }
  if (in_stack_00000018 == 1) {
    local_b0 = (ggml_tensor *)ggml_cont(*(undefined8 *)(in_RDI + 0x30),local_b0);
  }
  cb(in_RDX,in_RCX,name,in_stack_00000020);
  return local_b0;
}

Assistant:

ggml_tensor * llm_graph_context::build_moe_ffn(
         ggml_tensor * cur,
         ggml_tensor * gate_inp,
         ggml_tensor * up_exps,
         ggml_tensor * gate_exps,
         ggml_tensor * down_exps,
         ggml_tensor * exp_probs_b,
             int64_t   n_expert,
             int64_t   n_expert_used,
     llm_ffn_op_type   type_op,
                bool   norm_w,
                bool   scale_w,
               float   w_scale,
         llama_expert_gating_func_type gating_op,
                 int   il) const {
    const int64_t n_embd   = cur->ne[0];
    const int64_t n_tokens = cur->ne[1];
    const bool weight_before_ffn = arch == LLM_ARCH_LLAMA4; // for llama4, we apply the sigmoid-ed weights before the FFN

    ggml_tensor * logits = build_lora_mm(gate_inp, cur); // [n_expert, n_tokens]
    cb(logits, "ffn_moe_logits", il);

    ggml_tensor * probs = nullptr;
    switch (gating_op) {
        case LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX:
            {
                probs = ggml_soft_max(ctx0, logits); // [n_expert, n_tokens]
            } break;
        case LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID:
            {
                probs = ggml_sigmoid(ctx0, logits); // [n_expert, n_tokens]
            } break;
        default:
            GGML_ABORT("fatal error");
    }
    cb(probs, "ffn_moe_probs", il);

    // add experts selection bias - introduced in DeepSeek V3
    // leave probs unbiased as it's later used to get expert weights
    ggml_tensor * selection_probs = probs;
    if (exp_probs_b != nullptr) {
        selection_probs = ggml_add(ctx0, probs, exp_probs_b);
        cb(selection_probs, "ffn_moe_probs_biased", il);
    }

    // llama4 doesn't have exp_probs_b, and sigmoid is only used after top_k
    // see: https://github.com/meta-llama/llama-models/blob/699a02993512fb36936b1b0741e13c06790bcf98/models/llama4/moe.py#L183-L198
    if (arch == LLM_ARCH_LLAMA4) {
        selection_probs = logits;
    }

    // select experts
    ggml_tensor * selected_experts = ggml_top_k(ctx0, selection_probs, n_expert_used); // [n_expert_used, n_tokens]
    cb(selected_experts->src[0], "ffn_moe_argsort", il);
    cb(selected_experts, "ffn_moe_topk", il);

    ggml_tensor * weights = ggml_get_rows(ctx0,
            ggml_reshape_3d(ctx0, probs, 1, n_expert, n_tokens), selected_experts); // [1, n_expert_used, n_tokens]
    cb(weights, "ffn_moe_weights", il);

    if (norm_w) {
        weights = ggml_reshape_2d(ctx0, weights, n_expert_used, n_tokens);

        ggml_tensor * weights_sum = ggml_sum_rows(ctx0, weights); // [1, n_tokens]
        cb(weights_sum, "ffn_moe_weights_sum", il);

        weights = ggml_div(ctx0, weights, weights_sum); // [n_expert_used, n_tokens]
        cb(weights, "ffn_moe_weights_norm", il);

        weights = ggml_reshape_3d(ctx0, weights, 1, n_expert_used, n_tokens);
    }
    if (scale_w) {
        weights = ggml_scale(ctx0, weights, w_scale);
        cb(weights, "ffn_moe_weights_scaled", il);
    }

    cur = ggml_reshape_3d(ctx0, cur, n_embd, 1, n_tokens);

    if (weight_before_ffn) {
        // TODO: this is a workaround as we don't yet have a repeat op that takes custom dim (ggml_repeat_4d)
        ggml_tensor * repeated = ggml_new_tensor_3d(ctx0, cur->type, n_embd, n_expert_used, n_tokens);
        repeated = ggml_repeat(ctx0, cur, repeated); // [n_embd, n_expert_used, n_tokens]
        cur = ggml_mul(ctx0, repeated, weights);
        cb(cur, "ffn_moe_weighted", il);
    }

    ggml_tensor * up = build_lora_mm_id(up_exps, cur, selected_experts); // [n_ff, n_expert_used, n_tokens]
    cb(up, "ffn_moe_up", il);

    ggml_tensor * gate = build_lora_mm_id(gate_exps, cur, selected_experts); // [n_ff, n_expert_used, n_tokens]
    cb(gate, "ffn_moe_gate", il);

    switch (type_op) {
        case LLM_FFN_SILU:
            {
                gate = ggml_silu(ctx0, gate);
                cb(gate, "ffn_moe_silu", il);
            } break;
        case LLM_FFN_GELU:
            {
                gate = ggml_gelu(ctx0, gate);
                cb(gate, "ffn_moe_gelu", il);
            } break;
        default:
            GGML_ABORT("fatal error");
    }

    ggml_tensor * par = ggml_mul(ctx0, up, gate); // [n_ff, n_expert_used, n_tokens]
    cb(par, "ffn_moe_gate_par", il);

    ggml_tensor * experts = build_lora_mm_id(down_exps, par, selected_experts); // [n_embd, n_expert_used, n_tokens]
    cb(experts, "ffn_moe_down", il);

    if (!weight_before_ffn) {
        experts = ggml_mul(ctx0, experts, weights);
        cb(cur, "ffn_moe_weighted", il);
    }

    // aggregate experts
    ggml_tensor * moe_out = nullptr;
    for (int i = 0; i < n_expert_used; ++i) {
        ggml_tensor * cur_expert = ggml_view_2d(ctx0, experts, n_embd, n_tokens,
                experts->nb[2], i*experts->nb[1]);

        if (i == 0) {
            moe_out = cur_expert;
        } else {
            moe_out = ggml_add(ctx0, moe_out, cur_expert);
        }
    }

    if (n_expert_used == 1) {
        // avoid returning a non-contiguous tensor
        moe_out = ggml_cont(ctx0, moe_out);
    }

    cb(moe_out, "ffn_moe_out", il);

    return moe_out;
}